

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O3

JL_STATUS ParseString(char *String,size_t StringLength,_Bool IsBareWord,_Bool AllowNewLines,
                     size_t *pAmountProcessed,char **pProcessedString)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  JL_STATUS JVar4;
  JL_STATUS JVar5;
  size_t i;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  char *pcVar9;
  undefined7 in_register_00000011;
  char *pcVar10;
  char *pcVar11;
  char **ppcVar12;
  undefined4 uVar13;
  long lVar14;
  long lVar15;
  uint32_t number;
  uint32_t lowSurrogate;
  uint local_74;
  char *local_70;
  size_t local_68;
  undefined4 local_5c;
  char *local_58;
  ulong *local_50;
  char **local_48;
  char *local_40;
  long local_38;
  
  JVar5 = JL_STATUS_INVALID_DATA;
  if ((int)CONCAT71(in_register_00000011,IsBareWord) == 0) {
    if (1 < StringLength) {
      pcVar10 = (char *)0x1;
      lVar14 = 0;
      do {
        cVar3 = String[(long)pcVar10];
        if (cVar3 == '\\') {
          pcVar6 = pcVar10 + 1;
          lVar15 = lVar14 + 1;
          if (((AllowNewLines) && (String[(long)pcVar6] == '\r')) &&
             ((String + 2)[(long)pcVar10] == '\n')) {
            pcVar6 = pcVar10 + 2;
            lVar15 = lVar14 + 2;
          }
        }
        else {
          if (cVar3 == (char)((*String == '\'') * '\x05' + '\"')) goto LAB_0011be78;
          pcVar6 = pcVar10;
          lVar15 = lVar14;
          if (cVar3 < ' ') {
            *pAmountProcessed = (size_t)pcVar10;
            return JL_STATUS_INVALID_DATA;
          }
        }
        lVar14 = lVar15 + 1;
        pcVar10 = pcVar6 + 1;
      } while (pcVar10 < StringLength);
    }
  }
  else if (StringLength != 0) {
    lVar14 = 0;
    pcVar6 = (char *)0x0;
    do {
      pcVar10 = pcVar6;
      bVar2 = String[(long)pcVar10];
      pcVar11 = pcVar10;
      if ((bVar2 == 0x24) || (bVar2 == 0x5f)) {
LAB_0011be5c:
        JVar4 = JL_STATUS_SUCCESS;
      }
      else if (bVar2 == 0x5c) {
        lVar14 = lVar14 + 1;
        pcVar11 = pcVar10 + 1;
        JVar4 = JVar5;
      }
      else {
        if ((byte)(bVar2 - 0x30) < 10) goto LAB_0011be5c;
        JVar4 = JL_STATUS_SUCCESS;
        if (0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) break;
      }
      JVar5 = JVar4;
      lVar14 = lVar14 + 1;
      pcVar6 = pcVar11 + 1;
    } while (pcVar11 + 1 < StringLength);
    if (JVar5 == JL_STATUS_SUCCESS) {
LAB_0011be78:
      local_5c = (undefined4)CONCAT71(in_register_00000009,AllowNewLines);
      local_48 = pProcessedString;
      pcVar6 = (char *)WjTestLib_Calloc(lVar14 + 1,1);
      if (pcVar6 == (char *)0x0) {
        JVar5 = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        pcVar11 = (char *)((CONCAT71(in_register_00000011,IsBareWord) & 0xffffffff ^ 1) & 0xff);
        ppcVar12 = local_48;
        pcVar9 = pcVar11;
        local_50 = pAmountProcessed;
        if (pcVar11 < pcVar10) {
          lVar15 = 0;
          uVar13 = local_5c;
          do {
            if (String[(long)pcVar11] != '\\') {
              pcVar6[lVar15] = String[(long)pcVar11];
              lVar15 = lVar15 + 1;
              goto LAB_0011c06b;
            }
            bVar2 = (String + 1)[(long)pcVar11];
            if (bVar2 < 0x62) {
              if (bVar2 < 0x2f) {
                if (bVar2 == 0x22) {
                  pcVar6[lVar15] = '\"';
                }
                else {
                  if (bVar2 != 0x27) goto switchD_0011bf1b_caseD_6f;
                  pcVar6[lVar15] = '\'';
                }
              }
              else if (bVar2 == 0x2f) {
                pcVar6[lVar15] = '/';
              }
              else {
                if (bVar2 != 0x5c) goto switchD_0011bf1b_caseD_6f;
                pcVar6[lVar15] = '\\';
              }
              goto LAB_0011c065;
            }
            switch(bVar2) {
            case 0x6e:
              pcVar6[lVar15] = '\n';
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
switchD_0011bf1b_caseD_6f:
              JVar5 = JL_STATUS_INVALID_DATA;
              if (((char)uVar13 == '\0') || ((bVar2 != 0xd && (bVar2 != 10)))) {
LAB_0011c24d:
                *local_50 = (ulong)pcVar11;
                WjTestLib_Free(pcVar6);
                return JVar5;
              }
              if ((String + 2)[(long)pcVar11] == '\n' && bVar2 == 0xd) {
                pcVar11 = pcVar11 + 1;
              }
              goto LAB_0011c068;
            case 0x72:
              pcVar6[lVar15] = '\r';
              break;
            case 0x74:
              pcVar6[lVar15] = '\t';
              break;
            case 0x75:
              JVar5 = JL_STATUS_INVALID_DATA;
              local_38 = lVar15;
              if (~(ulong)pcVar11 + lVar14 < 4) goto LAB_0011c24d;
              pcVar1 = String + (long)pcVar11;
              lVar15 = 0;
              do {
                bVar2 = (pcVar1 + 2)[lVar15];
                if ((9 < (byte)(bVar2 - 0x30)) &&
                   ((uVar7 = bVar2 - 0x41, 0x25 < uVar7 ||
                    ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) goto LAB_0011c24d;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 4);
              local_74 = 0;
              local_70 = pcVar6;
              local_58 = pcVar1;
              local_40 = pcVar9;
              __isoc99_sscanf(pcVar1 + 2,"%4x",&local_74);
              uVar7 = local_74;
              pcVar6 = local_70;
              if ((local_74 & 0xfffffc00) == 0xd800) {
                if (((~(ulong)pcVar11 + lVar14 < 10) || (local_58[6] != '\\')) ||
                   (local_58[7] != 'u')) goto LAB_0011c24d;
                lVar15 = 0;
                do {
                  bVar2 = (local_58 + 8)[lVar15];
                  if ((9 < (byte)(bVar2 - 0x30)) &&
                     ((uVar8 = bVar2 - 0x41, 0x25 < uVar8 ||
                      ((0x3f0000003fU >> ((ulong)uVar8 & 0x3f) & 1) == 0)))) goto LAB_0011c24d;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 4);
                local_68 = local_68 & 0xffffffff00000000;
                __isoc99_sscanf(local_58 + 8,"%4x",&local_68);
                pcVar6 = local_70;
                if (((uint)local_68 < 0xdc00) || (0xdfff < local_74)) goto LAB_0011c24d;
                local_74 = (uVar7 & 0x3ff) * 0x400 + ((uint)local_68 & 0x3ff) + 0x10000;
                pcVar9 = (char *)0xa;
              }
              else {
                pcVar9 = (char *)0x4;
                if ((local_74 & 0xfffffc00) == 0xdc00) goto LAB_0011c24d;
              }
              lVar15 = local_38;
              local_68 = 0;
              local_58 = pcVar9;
              JVar5 = JlUnicodeValueToUtf8(local_74,local_70 + local_38,&local_68);
              pcVar6 = local_70;
              if (JVar5 != JL_STATUS_SUCCESS) goto LAB_0011c24d;
              lVar15 = lVar15 + local_68;
              pcVar11 = pcVar11 + (long)local_58;
              ppcVar12 = local_48;
              pcVar9 = local_40;
              uVar13 = local_5c;
              goto LAB_0011c068;
            default:
              if (bVar2 == 0x62) {
                pcVar6[lVar15] = '\b';
              }
              else {
                if (bVar2 != 0x66) goto switchD_0011bf1b_caseD_6f;
                pcVar6[lVar15] = '\f';
              }
            }
LAB_0011c065:
            lVar15 = lVar15 + 1;
LAB_0011c068:
            pcVar11 = pcVar11 + 1;
LAB_0011c06b:
            pcVar11 = pcVar11 + 1;
          } while (pcVar11 < pcVar10);
        }
        *ppcVar12 = pcVar6;
        *local_50 = (ulong)(pcVar10 + (long)pcVar9);
        JVar5 = JL_STATUS_SUCCESS;
      }
    }
  }
  return JVar5;
}

Assistant:

static
JL_STATUS
    ParseString
    (
        char const*         String,
        size_t              StringLength,
        bool                IsBareWord,
        bool                AllowNewLines,
        size_t*             pAmountProcessed,
        char**              pProcessedString
    )
{
    JL_STATUS jlStatus;
    size_t strLength = 0;
    size_t strEndPos = 0;
    char* processedString = NULL;
    bool singleQuoted = '\'' == String[0] ? true : false;

    // Find end of string
    jlStatus = JL_STATUS_INVALID_DATA;
    if( IsBareWord )
    {
        // Find length of bareword. Simply scan through until we find a non valid bareword char
        for( size_t i=0; i<StringLength; i++ )
        {
            strEndPos = i;
            if( '\\' == String[i] )
            {
                // Skip next character
                i += 1;
                strLength += 1;
            }
            else if ( '_' == String[i] || '$' == String[i]
                      || ( String[i] >= 'a' && String[i] <= 'z' )
                      || ( String[i] >= 'A' && String[i] <= 'Z' )
                      || ( String[i] >= '0' && String[i] <= '9' ) )
            {
                jlStatus = JL_STATUS_SUCCESS;   // At least one character
            }
            else
            {
                // End of bareword
                break;
            }
            strLength += 1;
        }
    }
    else
    {
        // Quoted string. Find the length
        for( size_t i=1; i<StringLength; i++ )      // Start at 1 to skip the first double quote
        {
            strEndPos = i;
            if( '\\' == String[i] )
            {
                // Skip next character
                i += 1;
                strLength += 1;
                if( AllowNewLines )
                {
                    // Check if we are escaping a crlf sequence
                    if( '\r' == String[i] && '\n' == String[i+1] )
                    {
                        i += 1;
                        strLength += 1;
                    }
                }
            }
            else if(    ( !singleQuoted && '\"' == String[i] )
                     || (  singleQuoted && '\'' == String[i] ) )
            {
                jlStatus = JL_STATUS_SUCCESS;
                break;
            }
            else if( String[i] < 32 )
            {
                // Control chars not allowed.
                jlStatus = JL_STATUS_INVALID_DATA;
                *pAmountProcessed = i;
                break;
            }
            strLength += 1;
        }
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        // Allocate space for processed string
        size_t strPos = 0;
        processedString = JlAlloc( strLength + 1 );
        if( NULL != processedString )
        {
            // Process string
            for( size_t i=IsBareWord?0:1; i<strEndPos; i++ )     // Skip first char which is double quote unless IsBareWord true
            {
                char currentChar = String[i];

                if( '\\' == currentChar )
                {
                    // Escaped chars. (There will definitely be at least one character after this
                    // due to the way we parsed in previous loop)
                    char nextChar = String[i+1];
                    char nextNextChar = String[i+2];
                    if( 'n' == nextChar )
                    {
                        processedString[strPos] = '\n';
                        strPos += 1;
                    }
                    else if( 'r' == nextChar )
                    {
                        processedString[strPos] = '\r';
                        strPos += 1;
                    }
                    else if( 'f' == nextChar )
                    {
                        processedString[strPos] = '\f';
                        strPos += 1;
                    }
                    else if( 'b' == nextChar )
                    {
                        processedString[strPos] = '\b';
                        strPos += 1;
                    }
                    else if( 't' == nextChar )
                    {
                        processedString[strPos] = '\t';
                        strPos += 1;
                    }
                    else if( '\\' == nextChar )
                    {
                        processedString[strPos] = '\\';
                        strPos += 1;
                    }
                    else if( '/' == nextChar )
                    {
                        processedString[strPos] = '/';
                        strPos += 1;
                    }
                    else if( '\"' == nextChar )
                    {
                        processedString[strPos] = '\"';
                        strPos += 1;
                    }
                    else if( '\'' == nextChar )
                    {
                        processedString[strPos] = '\'';
                        strPos += 1;
                    }
                    else if( 'u' == nextChar )
                    {
                        size_t numExtraCharsRead = 0;
                        // attempt to convert the escaped unicode value.
                        jlStatus = ConvertEscapedUnicode( String+i+2, strLength-i-1, processedString, &strPos, &numExtraCharsRead );
                        if( JL_STATUS_SUCCESS == jlStatus )
                        {
                            // skip the processed chars (note this is after the \u, we will also skip the \u part later)
                            // numCharsRead will be either 4 or 10 depending whether surrogate pairs were used/
                            i += numExtraCharsRead;
                        }
                        else
                        {
                            *pAmountProcessed = i;
                            break;
                        }
                    }
                    else if( AllowNewLines && ( '\r' == nextChar || '\n' == nextChar ) )
                    {
                        // Escaped new lines are allowed, they get discarded
                        if( '\r' == nextChar && '\n' == nextNextChar )
                        {
                            // the Windows CR/LF was escaped without a separate escape for the \n
                            i += 1;  // skip the extra one
                        }
                    }
                    else
                    {
                        // Invalid escape char
                        jlStatus = JL_STATUS_INVALID_DATA;
                        *pAmountProcessed = i;
                        break;
                    }
                    i += 1;  // Skip the char after the initial backslash as we have processed it
                }
                else
                {
                    processedString[strPos] = currentChar;
                    strPos += 1;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pProcessedString = processedString;
                *pAmountProcessed = strEndPos + (IsBareWord ? 0 : 1);     // If not bareword then also skip the ending quote
            }
            else
            {
                JlFree( processedString );
            }
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }

    return jlStatus;
}